

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int build_loop_tree(gen_ctx_t gen_ctx)

{
  bb_t_conflict pbVar1;
  in_edge_t_conflict peVar2;
  VARR_loop_node_t *pVVar3;
  loop_node_t_conflict *__base;
  int iVar4;
  int extraout_EAX;
  loop_node_t_conflict plVar5;
  size_t sVar6;
  loop_node_t_conflict plVar7;
  loop_node_t_conflict plVar8;
  DLIST_in_edge_t *pDVar9;
  size_t in_RSI;
  char *op;
  bb_t pbVar10;
  func_cfg_t pfVar11;
  ulong uVar12;
  DLIST_bb_t *pDVar13;
  
  gen_ctx->curr_loop_node_index = 0;
  enumerate_bbs(gen_ctx);
  VARR_loop_node_ttrunc(gen_ctx->loop_entries,in_RSI);
  pDVar13 = &gen_ctx->curr_cfg->bbs;
  do {
    pbVar1 = pDVar13->head;
    if (pbVar1 == (bb_t_conflict)0x0) {
      pVVar3 = gen_ctx->loop_entries;
      if (pVVar3 == (VARR_loop_node_t *)0x0) {
        op = "addr";
      }
      else {
        __base = pVVar3->varr;
        plVar5 = (loop_node_t_conflict)VARR_loop_node_tlength(pVVar3);
        qsort(__base,(size_t)plVar5,8,compare_bb_loop_nodes);
        uVar12 = 0;
        while( true ) {
          sVar6 = VARR_loop_node_tlength(gen_ctx->loop_entries);
          if (sVar6 <= uVar12) {
            plVar5 = (loop_node_t_conflict)0x0;
            plVar7 = create_loop_node(gen_ctx,(bb_t_conflict)0x0);
            pfVar11 = gen_ctx->curr_cfg;
            pfVar11->root_loop_node = plVar7;
            pDVar13 = &pfVar11->bbs;
            while (pbVar1 = pDVar13->head, pbVar1 != (bb_t_conflict)0x0) {
              plVar7 = top_loop_node(pbVar1);
              if (plVar7 != pfVar11->root_loop_node) {
                plVar5 = plVar7;
                DLIST_loop_node_t_append(&pfVar11->root_loop_node->children,plVar7);
                pfVar11 = gen_ctx->curr_cfg;
                plVar7->parent = pfVar11->root_loop_node;
              }
              pDVar13 = (DLIST_bb_t *)&(pbVar1->bb_link).next;
            }
            setup_loop_pressure((gen_ctx_t)pfVar11->root_loop_node,plVar5);
            return extraout_EAX;
          }
          pVVar3 = gen_ctx->loop_entries;
          if (((pVVar3 == (VARR_loop_node_t *)0x0) || (pVVar3->varr == (loop_node_t_conflict *)0x0))
             || (pVVar3->els_num <= uVar12)) break;
          pbVar1 = pVVar3->varr[uVar12]->bb;
          VARR_loop_node_ttrunc(gen_ctx->loop_nodes,(size_t)plVar5);
          VARR_loop_node_ttrunc(gen_ctx->queue_nodes,(size_t)plVar5);
          bitmap_clear(gen_ctx->temp_bitmap);
          pDVar9 = &pbVar1->in_edges;
          while (peVar2 = pDVar9->head, peVar2 != (in_edge_t_conflict)0x0) {
            if ((peVar2->back_edge_p != '\0') && (peVar2->src != pbVar1)) {
              plVar7 = top_loop_node(peVar2->src);
              plVar5 = (loop_node_t_conflict)(ulong)plVar7->index;
              iVar4 = bitmap_set_bit_p(gen_ctx->temp_bitmap,(size_t)plVar5);
              if ((iVar4 != 0) && ((peVar2->src->pre != 0 || (peVar2->src->rpost != 0)))) {
                VARR_loop_node_tpush(gen_ctx->loop_nodes,plVar7);
                VARR_loop_node_tpush(gen_ctx->queue_nodes,plVar7);
                plVar5 = plVar7;
              }
            }
            pDVar9 = (DLIST_in_edge_t *)&(peVar2->in_link).next;
          }
          while( true ) {
            sVar6 = VARR_loop_node_tlength(gen_ctx->queue_nodes);
            if (sVar6 == 0) break;
            plVar7 = VARR_loop_node_tpop(gen_ctx->queue_nodes);
            pbVar10 = plVar7->bb;
            if (pbVar10 == (bb_t)0x0) {
              pbVar10 = plVar7->entry->bb;
            }
            if (pbVar10 == (gen_ctx->curr_cfg->bbs).head) goto LAB_0012efd7;
            pDVar9 = &pbVar10->in_edges;
            while (peVar2 = pDVar9->head, peVar2 != (in_edge_t_conflict)0x0) {
              if (peVar2->src != pbVar1) {
                plVar7 = top_loop_node(peVar2->src);
                plVar5 = (loop_node_t_conflict)(ulong)plVar7->index;
                iVar4 = bitmap_set_bit_p(gen_ctx->temp_bitmap,(size_t)plVar5);
                if ((iVar4 != 0) && ((peVar2->src->pre != 0 || (peVar2->src->rpost != 0)))) {
                  VARR_loop_node_tpush(gen_ctx->loop_nodes,plVar7);
                  VARR_loop_node_tpush(gen_ctx->queue_nodes,plVar7);
                  plVar5 = plVar7;
                }
              }
              pDVar9 = (DLIST_in_edge_t *)&(peVar2->in_link).next;
            }
          }
          plVar7 = pbVar1->loop_node;
          VARR_loop_node_tpush(gen_ctx->loop_nodes,plVar7);
          plVar5 = (loop_node_t_conflict)0x0;
          plVar8 = create_loop_node(gen_ctx,(bb_t_conflict)0x0);
          plVar8->entry = plVar7;
          while( true ) {
            sVar6 = VARR_loop_node_tlength(gen_ctx->loop_nodes);
            if (sVar6 == 0) break;
            plVar7 = VARR_loop_node_tpop(gen_ctx->loop_nodes);
            plVar5 = plVar7;
            DLIST_loop_node_t_append(&plVar8->children,plVar7);
            plVar7->parent = plVar8;
          }
LAB_0012efd7:
          uVar12 = uVar12 + 1;
        }
        op = "get";
      }
      mir_varr_assert_fail(op,"loop_node_t");
    }
    plVar5 = create_loop_node(gen_ctx,pbVar1);
    pDVar9 = &pbVar1->in_edges;
    plVar5->entry = plVar5;
    do {
      peVar2 = pDVar9->head;
      if (peVar2 == (in_edge_t_conflict)0x0) goto LAB_0012ee2b;
      pDVar9 = (DLIST_in_edge_t *)&(peVar2->in_link).next;
    } while (peVar2->back_edge_p == '\0');
    VARR_loop_node_tpush(gen_ctx->loop_entries,plVar5);
LAB_0012ee2b:
    pDVar13 = (DLIST_bb_t *)&(pbVar1->bb_link).next;
  } while( true );
}

Assistant:

static int build_loop_tree (gen_ctx_t gen_ctx) {
  loop_node_t loop_node;
  edge_t e;
  int loops_p = FALSE;

  curr_loop_node_index = 0;
  enumerate_bbs (gen_ctx);
  VARR_TRUNC (loop_node_t, loop_entries, 0);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    loop_node = create_loop_node (gen_ctx, bb);
    loop_node->entry = loop_node;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (e->back_edge_p) {
        VARR_PUSH (loop_node_t, loop_entries, loop_node);
        break;
      }
  }
  qsort (VARR_ADDR (loop_node_t, loop_entries), VARR_LENGTH (loop_node_t, loop_entries),
         sizeof (loop_node_t), compare_bb_loop_nodes);
  for (size_t i = 0; i < VARR_LENGTH (loop_node_t, loop_entries); i++)
    if (process_loop (gen_ctx, VARR_GET (loop_node_t, loop_entries, i)->bb)) loops_p = TRUE;
  curr_cfg->root_loop_node = create_loop_node (gen_ctx, NULL);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    if ((loop_node = top_loop_node (bb)) != curr_cfg->root_loop_node) {
      DLIST_APPEND (loop_node_t, curr_cfg->root_loop_node->children, loop_node);
      loop_node->parent = curr_cfg->root_loop_node;
    }
  setup_loop_pressure (gen_ctx, curr_cfg->root_loop_node);
  return loops_p;
}